

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Gia_Man_t * Gia_ManMuxRestructure(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Bit_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar5;
  uint *puVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  int Value1;
  int Value0;
  Gia_Obj_t *pFan1;
  Vec_Bit_t *vUsed;
  int nNodes;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  iVar1 = Gia_ManHasChoices(p);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xee,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xef,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xf0,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar5;
  puVar6 = (uint *)calloc((long)p_01->nObjsAlloc,4);
  p_01->pMuxes = puVar6;
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 0;
  Gia_ManHashStart(p_01);
  vUsed._4_4_ = 1;
  do {
    bVar9 = false;
    if (vUsed._4_4_ < p->nObjs) {
      _nNodes = Gia_ManObj(p,vUsed._4_4_);
      bVar9 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      Vec_BitFree(p_00);
      Gia_ManHashStop(p_01);
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_01,iVar1);
      pGVar8 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar8;
    }
    iVar1 = Gia_ObjIsCi(_nNodes);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_nNodes);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsBuf(_nNodes);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsMuxId(p,vUsed._4_4_);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjFaninId0(_nNodes,vUsed._4_4_);
            iVar1 = Gia_ObjIsMuxId(p,iVar1);
            if (iVar1 != 0) {
              iVar1 = Gia_ObjFaninId0(_nNodes,vUsed._4_4_);
              iVar1 = Vec_BitEntry(p_00,iVar1);
              if (iVar1 == 0) {
                iVar1 = Gia_ObjFaninId1(_nNodes,vUsed._4_4_);
                iVar1 = Gia_ObjIsMuxId(p,iVar1);
                if (iVar1 != 0) {
                  iVar1 = Gia_ObjFaninId1(_nNodes,vUsed._4_4_);
                  iVar1 = Vec_BitEntry(p_00,iVar1);
                  if (iVar1 == 0) {
                    iVar1 = Gia_ObjFaninId0(_nNodes,vUsed._4_4_);
                    iVar1 = Gia_ObjFaninId2(p,iVar1);
                    iVar3 = Gia_ObjFaninId1(_nNodes,vUsed._4_4_);
                    iVar3 = Gia_ObjFaninId2(p,iVar3);
                    if (iVar1 == iVar3) {
                      pGVar7 = Gia_ObjFanin1(_nNodes);
                      iVar1 = Gia_ObjFanin2Copy(p,_nNodes);
                      iVar3 = Gia_ObjFanin2Copy(p,pGVar7);
                      iVar4 = Gia_ObjFanin0Copy(_nNodes);
                      iVar1 = Gia_ManHashMux(p_01,iVar1,iVar3,iVar4);
                      iVar3 = Gia_ObjFanin1Copy(pGVar7);
                      iVar4 = Gia_ObjFanin0Copy(pGVar7);
                      iVar3 = Gia_ManHashMux(p_01,iVar1,iVar3,iVar4);
                      iVar4 = Gia_ObjFanin2Copy(p,_nNodes);
                      uVar2 = Gia_ManHashMux(p_01,iVar4,iVar3,iVar1);
                      _nNodes->Value = uVar2;
                      iVar1 = Gia_ObjFaninId0(_nNodes,vUsed._4_4_);
                      Vec_BitWriteEntry(p_00,iVar1,1);
                      iVar1 = Gia_ObjFaninId1(_nNodes,vUsed._4_4_);
                      Vec_BitWriteEntry(p_00,iVar1,1);
                      Vec_BitWriteEntry(p_00,vUsed._4_4_,1);
                      goto LAB_002282d8;
                    }
                  }
                }
              }
            }
          }
          iVar1 = Gia_ObjIsMuxId(p,vUsed._4_4_);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsXor(_nNodes);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjFanin0Copy(_nNodes);
              iVar3 = Gia_ObjFanin1Copy(_nNodes);
              uVar2 = Gia_ManHashAnd(p_01,iVar1,iVar3);
              _nNodes->Value = uVar2;
            }
            else {
              iVar1 = Gia_ObjFanin0Copy(_nNodes);
              iVar3 = Gia_ObjFanin1Copy(_nNodes);
              uVar2 = Gia_ManHashXor(p_01,iVar1,iVar3);
              _nNodes->Value = uVar2;
            }
          }
          else {
            iVar1 = Gia_ObjFanin2Copy(p,_nNodes);
            iVar3 = Gia_ObjFanin1Copy(_nNodes);
            iVar4 = Gia_ObjFanin0Copy(_nNodes);
            uVar2 = Gia_ManHashMux(p_01,iVar1,iVar3,iVar4);
            _nNodes->Value = uVar2;
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_nNodes);
          uVar2 = Gia_ManAppendBuf(p_01,iVar1);
          _nNodes->Value = uVar2;
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_nNodes);
        uVar2 = Gia_ManAppendCo(p_01,iVar1);
        _nNodes->Value = uVar2;
      }
    }
    else {
      uVar2 = Gia_ManAppendCi(p_01);
      _nNodes->Value = uVar2;
    }
LAB_002282d8:
    vUsed._4_4_ = vUsed._4_4_ + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManMuxRestructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    assert( !Gia_ManHasChoices(p) );
    assert( !Gia_ManHasMapping(p) );
    assert( p->pMuxes != NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId0(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId0(pObj, i)) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId1(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId1(pObj, i)) &&
                  Gia_ObjFaninId2(p, Gia_ObjFaninId0(pObj, i)) == Gia_ObjFaninId2(p, Gia_ObjFaninId1(pObj, i))  )
        {
            Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
            int Value0 = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin2Copy(p, pFan1), Gia_ObjFanin0Copy(pObj) );
            int Value1 = Gia_ManHashMux( pNew, Value0, Gia_ObjFanin1Copy(pFan1), Gia_ObjFanin0Copy(pFan1) );
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Value1, Value0 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, i, 1 );
            nNodes++;
        }
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Vec_BitFree( vUsed );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}